

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextoption.h
# Opt level: O3

bool __thiscall QTextEngine::isRightToLeft(QTextEngine *this)

{
  undefined1 uVar1;
  uint uVar2;
  LayoutDirection LVar3;
  QInputMethod *this_00;
  LayoutData *pLVar4;
  bool bVar5;
  
  uVar2 = *(uint *)&this->option >> 0xe & 3;
  if (uVar2 == 0) {
    bVar5 = false;
  }
  else if (uVar2 == 1) {
    bVar5 = true;
  }
  else {
    pLVar4 = this->layoutData;
    if (pLVar4 == (LayoutData *)0x0) {
      itemize(this);
      pLVar4 = this->layoutData;
    }
    if ((pLVar4->string).d.size != 0) {
      uVar1 = QString::isRightToLeft();
      return (bool)uVar1;
    }
    this_00 = QGuiApplication::inputMethod();
    LVar3 = QInputMethod::inputDirection(this_00);
    bVar5 = LVar3 == RightToLeft;
  }
  return bVar5;
}

Assistant:

inline Qt::LayoutDirection textDirection() const { return Qt::LayoutDirection(direction); }